

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O3

void __thiscall
irr::core::array<irr::core::string<unsigned_long>_>::push_back
          (array<irr::core::string<unsigned_long>_> *this,string<unsigned_long> *element)

{
  uint uVar1;
  uint uVar2;
  string<unsigned_long> local_28;
  
  uVar1 = this->used;
  uVar2 = uVar1 + 1;
  if (this->allocated < uVar2) {
    local_28.allocated = 1;
    local_28.used = 1;
    local_28.array = (unsigned_long *)operator_new__(8);
    *local_28.array = 0;
    string<unsigned_long>::operator=(&local_28,element);
    reallocate(this,this->used * 2 + 1);
    uVar1 = this->used;
    this->used = uVar1 + 1;
    string<unsigned_long>::operator=(this->data + uVar1,&local_28);
    this->is_sorted = false;
    if (local_28.array != (unsigned_long *)0x0) {
      operator_delete__(local_28.array);
    }
  }
  else {
    this->used = uVar2;
    string<unsigned_long>::operator=(this->data + uVar1,element);
    this->is_sorted = false;
  }
  return;
}

Assistant:

void push_back(const T& element)
	{
		if (used + 1 > allocated)
		{
			// reallocate(used * 2 +1);
			// this doesn't work if the element is in the same array. So
			// we'll copy the element first to be sure we'll get no data
			// corruption

			T e;
			e = element;           // copy element
			reallocate(used * 2 +1); // increase data block
			data[used++] = e;        // push_back
			is_sorted = false; 
			return;
		}

		data[used++] = element;
		is_sorted = false;
	}